

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AppendFlagEscape(cmLocalGenerator *this,string *flags,string *rawFlag)

{
  pointer pcVar1;
  size_type sVar2;
  bool unescapeNinjaConfiguration;
  string_view str;
  string local_50;
  
  pcVar1 = (rawFlag->_M_dataplus)._M_p;
  sVar2 = rawFlag->_M_string_length;
  unescapeNinjaConfiguration =
       cmState::UseNinjaMulti
                 ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                  super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                  super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                  super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  str._M_str = pcVar1;
  str._M_len = sVar2;
  cmOutputConverter::EscapeForShell_abi_cxx11_
            (&local_50,&this->super_cmOutputConverter,str,false,false,false,
             unescapeNinjaConfiguration,false);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlagEscape(std::string& flags,
                                        const std::string& rawFlag) const
{
  this->AppendFlags(
    flags,
    this->EscapeForShell(rawFlag, false, false, false, this->IsNinjaMulti()));
}